

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntInsert(Vec_Int_t *p,int iHere,int Entry)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (iHere <= p->nSize) {
    Vec_IntPush(p,0);
    piVar1 = p->pArray;
    lVar3 = (long)p->nSize << 0x20;
    lVar2 = (long)p->nSize;
    while( true ) {
      lVar4 = lVar2 + -1;
      lVar3 = lVar3 + -0x100000000;
      if (lVar4 <= iHere) break;
      piVar1[lVar4] = piVar1[lVar2 + -2];
      lVar2 = lVar4;
    }
    *(int *)((long)piVar1 + (lVar3 >> 0x1e)) = Entry;
    return;
  }
  __assert_fail("iHere >= 0 && iHere <= p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x413,"void Vec_IntInsert(Vec_Int_t *, int, int)");
}

Assistant:

static inline void Vec_IntInsert( Vec_Int_t * p, int iHere, int Entry )
{
    int i;
    assert( iHere >= 0 && iHere <= p->nSize );
    Vec_IntPush( p, 0 );
    for ( i = p->nSize - 1; i > iHere; i-- )
        p->pArray[i] = p->pArray[i-1];
    p->pArray[i] = Entry;
}